

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_types.cpp
# Opt level: O2

void BanMapFromJson(UniValue *bans_json,banmap_t *bans)

{
  long lVar1;
  pointer pUVar2;
  string_view source_file;
  string_view source_file_00;
  bool bVar3;
  int iVar4;
  vector<UniValue,_std::allocator<UniValue>_> *pvVar5;
  UniValue *pUVar6;
  string *subnet_str;
  Logger *pLVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  pointer this;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view logging_function_00;
  string_view str;
  string_view str_00;
  int version;
  CSubNet subnet;
  string local_78;
  string log_msg_1;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pvVar5 = UniValue::getValues(bans_json);
  pUVar2 = (pvVar5->super__Vector_base<UniValue,_std::allocator<UniValue>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (this = (pvVar5->super__Vector_base<UniValue,_std::allocator<UniValue>_>)._M_impl.
              super__Vector_impl_data._M_start; this != pUVar2; this = this + 1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&subnet,"version",(allocator<char> *)&log_msg_1);
    pUVar6 = UniValue::operator[](this,(string *)&subnet);
    iVar4 = UniValue::getInt<int>(pUVar6);
    std::__cxx11::string::~string((string *)&subnet);
    version = iVar4;
    if (iVar4 == 1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&subnet,"address",(allocator<char> *)&log_msg_1);
      pUVar6 = UniValue::operator[](this,(string *)&subnet);
      subnet_str = UniValue::get_str_abi_cxx11_(pUVar6);
      std::__cxx11::string::~string((string *)&subnet);
      LookupSubNet(&subnet,subnet_str);
      bVar3 = CSubNet::IsValid(&subnet);
      if (bVar3) {
        CBanEntry::CBanEntry((CBanEntry *)&log_msg_1,this);
        std::
        map<CSubNet,_CBanEntry,_std::less<CSubNet>,_std::allocator<std::pair<const_CSubNet,_CBanEntry>_>_>
        ::insert_or_assign<CBanEntry>(bans,&subnet,(CBanEntry *)&log_msg_1);
      }
      else {
        pLVar7 = LogInstance();
        bVar3 = BCLog::Logger::Enabled(pLVar7);
        if (bVar3) {
          log_msg_1._M_dataplus._M_p = (pointer)&log_msg_1.field_2;
          log_msg_1._M_string_length = 0;
          log_msg_1.field_2._M_local_buf[0] = '\0';
          tinyformat::format<std::__cxx11::string>
                    (&local_78,
                     (tinyformat *)
                     "Dropping entry with unparseable address or subnet (%s) from ban list\n",
                     (char *)subnet_str,in_RCX);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    (&log_msg_1,&local_78);
          std::__cxx11::string::~string((string *)&local_78);
          pLVar7 = LogInstance();
          local_78._M_dataplus._M_p = (pointer)0x56;
          local_78._M_string_length = 0x72d284;
          in_RCX = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xe;
          source_file_00._M_str =
               "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net_types.cpp"
          ;
          source_file_00._M_len = 0x56;
          logging_function_00._M_str = "BanMapFromJson";
          logging_function_00._M_len = 0xe;
          str_00._M_str = log_msg_1._M_dataplus._M_p;
          str_00._M_len = log_msg_1._M_string_length;
          BCLog::Logger::LogPrintStr(pLVar7,str_00,logging_function_00,source_file_00,0x45,ALL,Info)
          ;
          std::__cxx11::string::~string((string *)&log_msg_1);
        }
      }
      prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
                ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&subnet);
    }
    else {
      pLVar7 = LogInstance();
      bVar3 = BCLog::Logger::Enabled(pLVar7);
      if (bVar3) {
        subnet.network.m_addr._union.indirect_contents.indirect =
             (char *)&subnet.network.m_addr._size;
        subnet.network.m_addr._union._8_8_ = 0;
        subnet.network.m_addr._size._0_1_ = 0;
        tinyformat::format<int>
                  (&log_msg_1,"Dropping entry with unknown version (%s) from ban list\n",&version);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&subnet,
                   &log_msg_1);
        std::__cxx11::string::~string((string *)&log_msg_1);
        pLVar7 = LogInstance();
        log_msg_1._M_dataplus._M_p = (pointer)0x56;
        log_msg_1._M_string_length = (size_type)anon_var_dwarf_1dee92d;
        in_RCX = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xe;
        source_file._M_str =
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net_types.cpp"
        ;
        source_file._M_len = 0x56;
        logging_function._M_str = "BanMapFromJson";
        logging_function._M_len = 0xe;
        str._M_str = subnet.network.m_addr._union.indirect_contents.indirect;
        str._M_len = subnet.network.m_addr._union._8_8_;
        BCLog::Logger::LogPrintStr(pLVar7,str,logging_function,source_file,0x3f,ALL,Info);
        std::__cxx11::string::~string((string *)&subnet);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void BanMapFromJson(const UniValue& bans_json, banmap_t& bans)
{
    for (const auto& ban_entry_json : bans_json.getValues()) {
        const int version{ban_entry_json[BANMAN_JSON_VERSION_KEY].getInt<int>()};
        if (version != CBanEntry::CURRENT_VERSION) {
            LogPrintf("Dropping entry with unknown version (%s) from ban list\n", version);
            continue;
        }
        const auto& subnet_str = ban_entry_json[BANMAN_JSON_ADDR_KEY].get_str();
        const CSubNet subnet{LookupSubNet(subnet_str)};
        if (!subnet.IsValid()) {
            LogPrintf("Dropping entry with unparseable address or subnet (%s) from ban list\n", subnet_str);
            continue;
        }
        bans.insert_or_assign(subnet, CBanEntry{ban_entry_json});
    }
}